

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ConvertMeshes(Discreet3DSImporter *this,aiScene *pcOut)

{
  uint uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  bool bVar4;
  size_type sVar5;
  ulong uVar6;
  size_type *psVar7;
  reference pMVar8;
  reference puVar9;
  type pvVar10;
  ulong *puVar11;
  aiVector3D *paVar12;
  reference pvVar13;
  uint *puVar14;
  reference pvVar15;
  reference pvVar16;
  aiMesh *paVar17;
  reference ppaVar18;
  DeadlyImportError *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__p;
  aiFace *paVar19;
  ulong uVar20;
  aiVector3t<float> *local_5f0;
  aiVector3t<float> *local_5c8;
  aiVector3t<float> *local_5a0;
  aiFace *local_578;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_518;
  allocator local_4d9;
  string local_4d8;
  uint local_4b4;
  uint local_4b0;
  uint a_2;
  uint idx;
  uint a_1;
  aiFace *face;
  uint local_498;
  uint index;
  uint base;
  uint q;
  aiMesh *meshOut;
  iterator iStack_480;
  uint p;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_478;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_470;
  const_iterator a;
  uint iNum;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
  aiSplit;
  __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
  local_450;
  iterator i;
  aiString name;
  uint num;
  uint iFaceCnt;
  undefined1 local_30 [8];
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  aiScene *pcOut_local;
  Discreet3DSImporter *this_local;
  
  avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pcOut;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_30);
  sVar5 = std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::size
                    (&this->mScene->mMeshes);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_30,sVar5 * 2);
  name.data[0x3fc] = '\0';
  name.data[0x3fd] = '\0';
  name.data[0x3fe] = '\0';
  name.data[0x3ff] = '\0';
  name.data[0x3f8] = '\0';
  name.data[0x3f9] = '\0';
  name.data[0x3fa] = '\0';
  name.data[0x3fb] = '\0';
  aiString::aiString((aiString *)&i);
  local_450._M_current =
       (Mesh *)std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::begin
                         (&this->mScene->mMeshes);
  while( true ) {
    aiSplit._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>,_true,_true>
                    )std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::end
                               (&this->mScene->mMeshes);
    bVar4 = __gnu_cxx::operator!=
                      (&local_450,
                       (__normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                        *)&aiSplit);
    if (!bVar4) break;
    sVar5 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                      (&this->mScene->mMaterials);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar5;
    uVar6 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar20 = uVar6 + 8;
    if (0xfffffffffffffff7 < uVar6) {
      uVar20 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    psVar7 = (size_type *)operator_new__(uVar20);
    *psVar7 = sVar5;
    __p = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(psVar7 + 1);
    if (sVar5 != 0) {
      local_518 = __p;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_518);
        local_518 = local_518 + 1;
      } while (local_518 != __p + sVar5);
    }
    std::
    unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>[],std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]>>
    ::
    unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]>,void,bool>
              ((unique_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>[],std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]>>
                *)&stack0xfffffffffffffba0,__p);
    i._M_current._0_4_ =
         ASSIMP_itoa10<1024ul>((char (*) [1024])((long)&i._M_current + 4),name.data._1016_4_);
    a._M_current._4_4_ = 0;
    pMVar8 = __gnu_cxx::
             __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
             ::operator*(&local_450);
    local_478._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&pMVar8->mFaceMaterials);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_470,&local_478);
    while( true ) {
      pMVar8 = __gnu_cxx::
               __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
               ::operator*(&local_450);
      iStack_480 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&pMVar8->mFaceMaterials);
      bVar4 = __gnu_cxx::operator!=(&local_470,&stack0xfffffffffffffb80);
      if (!bVar4) break;
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_470);
      pvVar10 = std::
                unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                ::operator[]((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                              *)&stack0xfffffffffffffba0,(ulong)*puVar9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar10,(value_type_conflict3 *)((long)&a._M_current + 4));
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_470);
      a._M_current._4_4_ = a._M_current._4_4_ + 1;
    }
    for (meshOut._4_4_ = 0; uVar6 = (ulong)meshOut._4_4_,
        sVar5 = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                          (&this->mScene->mMaterials), uVar6 < sVar5;
        meshOut._4_4_ = meshOut._4_4_ + 1) {
      pvVar10 = std::
                unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                ::operator[]((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                              *)&stack0xfffffffffffffba0,(ulong)meshOut._4_4_);
      bVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar10);
      if (!bVar4) {
        paVar17 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar17);
        _base = paVar17;
        aiString::operator=(&paVar17->mName,(aiString *)&i);
        _base->mPrimitiveTypes = 4;
        _base->mMaterialIndex = meshOut._4_4_;
        pMVar8 = __gnu_cxx::
                 __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                 ::operator*(&local_450);
        _base->mColors[0] = (aiColor4D *)pMVar8;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_30,(value_type *)&base);
        pvVar10 = std::
                  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                  ::operator[]((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                *)&stack0xfffffffffffffba0,(ulong)meshOut._4_4_);
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
        _base->mNumFaces = (uint)sVar5;
        _base->mNumVertices = _base->mNumFaces * 3;
        uVar6 = (ulong)_base->mNumFaces;
        puVar11 = (ulong *)operator_new__(uVar6 << 4 | 8);
        *puVar11 = uVar6;
        paVar19 = (aiFace *)(puVar11 + 1);
        if (uVar6 != 0) {
          local_578 = paVar19;
          do {
            aiFace::aiFace(local_578);
            local_578 = local_578 + 1;
          } while (local_578 != paVar19 + uVar6);
        }
        _base->mFaces = paVar19;
        name.data._1020_4_ = name.data._1020_4_ + _base->mNumFaces;
        uVar6 = (ulong)_base->mNumVertices;
        paVar12 = (aiVector3D *)operator_new__(uVar6 * 0xc);
        if (uVar6 != 0) {
          local_5a0 = paVar12;
          do {
            aiVector3t<float>::aiVector3t(local_5a0);
            local_5a0 = local_5a0 + 1;
          } while (local_5a0 != paVar12 + uVar6);
        }
        _base->mVertices = paVar12;
        uVar6 = (ulong)_base->mNumVertices;
        paVar12 = (aiVector3D *)operator_new__(uVar6 * 0xc);
        if (uVar6 != 0) {
          local_5c8 = paVar12;
          do {
            aiVector3t<float>::aiVector3t(local_5c8);
            local_5c8 = local_5c8 + 1;
          } while (local_5c8 != paVar12 + uVar6);
        }
        _base->mNormals = paVar12;
        pMVar8 = __gnu_cxx::
                 __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                 ::operator*(&local_450);
        sVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&pMVar8->mTexCoords);
        if (sVar5 != 0) {
          uVar6 = (ulong)_base->mNumVertices;
          paVar12 = (aiVector3D *)operator_new__(uVar6 * 0xc);
          if (uVar6 != 0) {
            local_5f0 = paVar12;
            do {
              aiVector3t<float>::aiVector3t(local_5f0);
              local_5f0 = local_5f0 + 1;
            } while (local_5f0 != paVar12 + uVar6);
          }
          _base->mTextureCoords[0] = paVar12;
        }
        index = 0;
        local_498 = 0;
        while( true ) {
          uVar6 = (ulong)index;
          pvVar10 = std::
                    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                    ::operator[]((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                  *)&stack0xfffffffffffffba0,(ulong)meshOut._4_4_);
          sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
          if (sVar5 <= uVar6) break;
          pvVar10 = std::
                    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                    ::operator[]((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                                  *)&stack0xfffffffffffffba0,(ulong)meshOut._4_4_);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar10,(ulong)index);
          face._4_4_ = *pvVar13;
          _idx = _base->mFaces + index;
          puVar14 = (uint *)operator_new__(0xc);
          _idx->mIndices = puVar14;
          _idx->mNumIndices = 3;
          for (a_2 = 0; a_2 < 3; a_2 = a_2 + 1) {
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                     ::operator*(&local_450);
            pvVar15 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::
                      operator[](&(pMVar8->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces
                                 ,(ulong)face._4_4_);
            local_4b0 = (pvVar15->super_FaceWithSmoothingGroup).mIndices[a_2];
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                     ::operator*(&local_450);
            pvVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                      operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 pMVar8,(ulong)local_4b0);
            paVar12 = _base->mVertices + local_498;
            fVar3 = pvVar16->y;
            paVar12->x = pvVar16->x;
            paVar12->y = fVar3;
            paVar12->z = pvVar16->z;
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                     ::operator*(&local_450);
            pvVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                      operator[](&(pMVar8->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).
                                  mNormals,(ulong)local_4b0);
            paVar12 = _base->mNormals + local_498;
            fVar3 = pvVar16->y;
            paVar12->x = pvVar16->x;
            paVar12->y = fVar3;
            paVar12->z = pvVar16->z;
            pMVar8 = __gnu_cxx::
                     __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                     ::operator*(&local_450);
            sVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              (&pMVar8->mTexCoords);
            if (sVar5 != 0) {
              pMVar8 = __gnu_cxx::
                       __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
                       ::operator*(&local_450);
              pvVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[](&pMVar8->mTexCoords,(ulong)local_4b0);
              paVar12 = _base->mTextureCoords[0] + local_498;
              fVar3 = pvVar16->y;
              paVar12->x = pvVar16->x;
              paVar12->y = fVar3;
              paVar12->z = pvVar16->z;
            }
            _idx->mIndices[a_2] = local_498;
            local_498 = local_498 + 1;
          }
          index = index + 1;
        }
      }
    }
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
    ::~unique_ptr((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[],_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>[]>_>
                   *)&stack0xfffffffffffffba0);
    __gnu_cxx::
    __normal_iterator<Assimp::D3DS::Mesh_*,_std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>_>
    ::operator++(&local_450);
    name.data._1016_4_ = name.data._1016_4_ + 1;
  }
  sVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_30);
  *(int *)(avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = (int)sVar5;
  uVar1 = *(uint *)(avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 2);
  paVar17 = (aiMesh *)operator_new__((ulong)uVar1 << 3);
  memset(paVar17,0,(ulong)uVar1 << 3);
  avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[3] = paVar17;
  for (local_4b4 = 0;
      local_4b4 <
      *(uint *)(avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 2); local_4b4 = local_4b4 + 1) {
    ppaVar18 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_30,(ulong)local_4b4);
    avOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[3]->mColors[(ulong)local_4b4 - 6] =
         (aiColor4D *)*ppaVar18;
  }
  if (name.data._1020_4_ != 0) {
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_30);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d8,"No faces loaded. The mesh is empty",&local_4d9)
  ;
  DeadlyImportError::DeadlyImportError(this_00,&local_4d8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void Discreet3DSImporter::ConvertMeshes(aiScene* pcOut)
{
    std::vector<aiMesh*> avOutMeshes;
    avOutMeshes.reserve(mScene->mMeshes.size() * 2);

    unsigned int iFaceCnt = 0,num = 0;
    aiString name;

    // we need to split all meshes by their materials
    for (std::vector<D3DS::Mesh>::iterator i =  mScene->mMeshes.begin(); i != mScene->mMeshes.end();++i)    {
        std::unique_ptr< std::vector<unsigned int>[] > aiSplit(new std::vector<unsigned int>[mScene->mMaterials.size()]);

        name.length = ASSIMP_itoa10(name.data,num++);

        unsigned int iNum = 0;
        for (std::vector<unsigned int>::const_iterator a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a,++iNum)
        {
            aiSplit[*a].push_back(iNum);
        }
        // now generate submeshes
        for (unsigned int p = 0; p < mScene->mMaterials.size();++p)
        {
            if (aiSplit[p].empty()) {
                continue;
            }
            aiMesh* meshOut = new aiMesh();
            meshOut->mName = name;
            meshOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // be sure to setup the correct material index
            meshOut->mMaterialIndex = p;

            // use the color data as temporary storage
            meshOut->mColors[0] = (aiColor4D*)(&*i);
            avOutMeshes.push_back(meshOut);

            // convert vertices
            meshOut->mNumFaces = (unsigned int)aiSplit[p].size();
            meshOut->mNumVertices = meshOut->mNumFaces*3;

            // allocate enough storage for faces
            meshOut->mFaces = new aiFace[meshOut->mNumFaces];
            iFaceCnt += meshOut->mNumFaces;

            meshOut->mVertices = new aiVector3D[meshOut->mNumVertices];
            meshOut->mNormals  = new aiVector3D[meshOut->mNumVertices];
            if ((*i).mTexCoords.size())
            {
                meshOut->mTextureCoords[0] = new aiVector3D[meshOut->mNumVertices];
            }
            for (unsigned int q = 0, base = 0; q < aiSplit[p].size();++q)
            {
                unsigned int index = aiSplit[p][q];
                aiFace& face = meshOut->mFaces[q];

                face.mIndices = new unsigned int[3];
                face.mNumIndices = 3;

                for (unsigned int a = 0; a < 3;++a,++base)
                {
                    unsigned int idx = (*i).mFaces[index].mIndices[a];
                    meshOut->mVertices[base]  = (*i).mPositions[idx];
                    meshOut->mNormals [base]  = (*i).mNormals[idx];

                    if ((*i).mTexCoords.size())
                        meshOut->mTextureCoords[0][base] = (*i).mTexCoords[idx];

                    face.mIndices[a] = base;
                }
            }
        }
    }

    // Copy them to the output array
    pcOut->mNumMeshes = (unsigned int)avOutMeshes.size();
    pcOut->mMeshes = new aiMesh*[pcOut->mNumMeshes]();
    for (unsigned int a = 0; a < pcOut->mNumMeshes;++a) {
        pcOut->mMeshes[a] = avOutMeshes[a];
    }

    // We should have at least one face here
    if (!iFaceCnt) {
        throw DeadlyImportError("No faces loaded. The mesh is empty");
    }
}